

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csprng.cpp
# Opt level: O2

result_type __thiscall jbcoin::csprng_engine::operator()(csprng_engine *this)

{
  int iVar1;
  result_type in_RAX;
  result_type ret;
  
  ret = in_RAX;
  std::mutex::lock(&this->mutex_);
  iVar1 = RAND_bytes((uchar *)&ret,8);
  if (iVar1 != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return ret;
  }
  Throw<std::runtime_error,char_const(&)[21]>((char (*) [21])"Insufficient entropy");
}

Assistant:

csprng_engine::result_type
csprng_engine::operator()()
{
    result_type ret;

    std::lock_guard<std::mutex> lock (mutex_);

    auto const result = RAND_bytes (
        reinterpret_cast<unsigned char*>(&ret),
        sizeof(ret));

    if (result == 0)
        Throw<std::runtime_error> ("Insufficient entropy");

    return ret;
}